

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutils.cpp
# Opt level: O3

colvec * colvec_from_json(colvec *__return_storage_ptr__,json *json_node)

{
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  uint uVar4;
  const_reference pvVar5;
  double *__dest;
  undefined8 extraout_RAX;
  ulong uVar6;
  char (*x) [39];
  uword uVar7;
  vector<double,_std::allocator<double>_> raw_data;
  string data;
  string base64_data;
  vector<double,_std::allocator<double>_> local_78;
  string local_60;
  string local_40;
  
  pvVar5 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)json_node,"type");
  bVar3 = nlohmann::json_abi_v3_11_3::operator==<const_char_*,_0>(pvVar5,"colvec");
  if (!bVar3) {
    __assert_fail("json_node[\"type\"] == \"colvec\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/utils/jsonutils.cpp"
                  ,0x5e,"arma::colvec colvec_from_json(const nlohmann::json &)");
  }
  pvVar5 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)json_node,"base64_data");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_40,pvVar5);
  base64_decode(&local_60,&local_40,false);
  deserialize<double>(&local_78,(uint8_t *)local_60._M_dataplus._M_p,local_60._M_string_length);
  pdVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar1 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar5 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)json_node,"size");
  bVar3 = nlohmann::json_abi_v3_11_3::operator==<unsigned_long,_0>
                    ((long)pdVar2 - (long)pdVar1 >> 3,pvVar5);
  if (bVar3) {
    uVar6 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar4 = (uint)(uVar6 >> 3);
    (__return_storage_ptr__->super_Mat<double>).n_rows = uVar4;
    (__return_storage_ptr__->super_Mat<double>).n_cols = 1;
    (__return_storage_ptr__->super_Mat<double>).n_elem = uVar4;
    (__return_storage_ptr__->super_Mat<double>).n_alloc = 0;
    (__return_storage_ptr__->super_Mat<double>).vec_state = 1;
    (__return_storage_ptr__->super_Mat<double>).mem_state = 0;
    (__return_storage_ptr__->super_Mat<double>).mem = (double *)0x0;
    if (uVar4 < 0x11) {
      uVar7 = 0;
      __dest = (double *)0x0;
      if (uVar4 != 0) {
        __dest = (__return_storage_ptr__->super_Mat<double>).mem_local;
      }
      (__return_storage_ptr__->super_Mat<double>).mem = __dest;
    }
    else {
      x = (char (*) [39])(uVar6 & 0x7fffffff8);
      __dest = (double *)lkalloc::malloc((size_t)x);
      if (__dest == (double *)0x0) {
        arma::arma_stop_bad_alloc<char[39]>(x);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      (__return_storage_ptr__->super_Mat<double>).mem = __dest;
      uVar7 = (__return_storage_ptr__->super_Mat<double>).n_elem;
      uVar6 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    (__return_storage_ptr__->super_Mat<double>).n_alloc = uVar7;
    if (((uVar6 & 0x7fffffff8) != 0) &&
       (__dest != local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start)) {
      memcpy(__dest,local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,uVar6 & 0x7fffffff8);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("raw_data.size() == json_node[\"size\"]",
                "/workspace/llm4binary/github/license_c_cmakelists/libKriging[P]libKriging/src/lib/utils/jsonutils.cpp"
                ,0x62,"arma::colvec colvec_from_json(const nlohmann::json &)");
}

Assistant:

LIBKRIGING_EXPORT arma::colvec colvec_from_json(const nlohmann::json& json_node) {
  assert(json_node["type"] == "colvec");
  std::string base64_data = json_node["base64_data"];
  const std::string data = base64_decode(base64_data);
  std::vector<double> raw_data = deserialize<double>(reinterpret_cast<const uint8_t*>(data.data()), data.size());
  assert(raw_data.size() == json_node["size"]);
  return {raw_data};
}